

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_12(QPDF *pdf,char *arg2)

{
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDF::setOutputStreams((ostream *)pdf,(ostream *)0x0);
  QPDF::showLinearizationData();
  return;
}

Assistant:

static void
test_12(QPDF& pdf, char const* arg2)
{
#ifdef _MSC_VER
# pragma warning(disable : 4996)
#endif
#if (defined(__GNUC__) || defined(__clang__))
# pragma GCC diagnostic push
# pragma GCC diagnostic ignored "-Wdeprecated-declarations"
#endif
    pdf.setOutputStreams(nullptr, nullptr);
#if (defined(__GNUC__) || defined(__clang__))
# pragma GCC diagnostic pop
#endif
    pdf.showLinearizationData();
}